

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_op.h
# Opt level: O3

string * absl::lts_20240722::log_internal::MakeCheckOpString<long,unsigned_long>
                   (long v1,unsigned_long v2,char *exprtext)

{
  ulong uVar1;
  string *psVar2;
  CheckOpMessageBuilder comb;
  CheckOpMessageBuilder local_190 [112];
  ios_base local_120 [264];
  
  absl::lts_20240722::log_internal::CheckOpMessageBuilder::CheckOpMessageBuilder(local_190,exprtext)
  ;
  std::ostream::_M_insert<long>((long)local_190);
  uVar1 = absl::lts_20240722::log_internal::CheckOpMessageBuilder::ForVar2();
  std::ostream::_M_insert<unsigned_long>(uVar1);
  psVar2 = (string *)absl::lts_20240722::log_internal::CheckOpMessageBuilder::NewString_abi_cxx11_()
  ;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return psVar2;
}

Assistant:

std::string* MakeCheckOpString(T1 v1, T2 v2, const char* exprtext) {
  CheckOpMessageBuilder comb(exprtext);
  MakeCheckOpValueString(comb.ForVar1(), v1);
  MakeCheckOpValueString(comb.ForVar2(), v2);
  return comb.NewString();
}